

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O0

int coda_expression_is_equal(coda_expression *expr1,coda_expression *expr2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int local_34;
  int i;
  coda_expression_operation *op2;
  coda_expression_operation *op1;
  coda_expression *expr2_local;
  coda_expression *expr1_local;
  
  if (expr1 == (coda_expression *)0x0) {
    expr1_local._4_4_ = (uint)(expr2 == (coda_expression *)0x0);
  }
  else if (expr2 == (coda_expression *)0x0) {
    expr1_local._4_4_ = 0;
  }
  else if (expr1->tag == expr2->tag) {
    switch(expr1->tag) {
    case expr_constant_boolean:
      expr1_local._4_4_ = (uint)(expr1[1].tag == expr2[1].tag);
      break;
    case expr_constant_float:
      expr1_local._4_4_ = (uint)(*(double *)(expr1 + 1) == *(double *)(expr2 + 1));
      break;
    case expr_constant_integer:
      lVar1._0_4_ = expr1[1].tag;
      lVar1._4_4_ = expr1[1].result_type;
      lVar2._0_4_ = expr2[1].tag;
      lVar2._4_4_ = expr2[1].result_type;
      expr1_local._4_4_ = (uint)(lVar1 == lVar2);
      break;
    case expr_constant_rawstring:
    case expr_constant_string:
      lVar3._0_4_ = expr1[1].tag;
      lVar3._4_4_ = expr1[1].result_type;
      lVar4._0_4_ = expr2[1].tag;
      lVar4._4_4_ = expr2[1].result_type;
      if (lVar3 == lVar4) {
        __n._0_4_ = expr1[1].tag;
        __n._4_4_ = expr1[1].result_type;
        iVar8 = memcmp(*(void **)&expr1[1].is_constant,*(void **)&expr2[1].is_constant,__n);
        expr1_local._4_4_ = (uint)(iVar8 == 0);
      }
      else {
        expr1_local._4_4_ = 0;
      }
      break;
    default:
      lVar5._0_4_ = expr1[1].tag;
      lVar5._4_4_ = expr1[1].result_type;
      if (lVar5 == 0) {
        lVar7._0_4_ = expr2[1].tag;
        lVar7._4_4_ = expr2[1].result_type;
        if (lVar7 != 0) {
          return 0;
        }
      }
      else {
        lVar6._0_4_ = expr2[1].tag;
        lVar6._4_4_ = expr2[1].result_type;
        if (lVar6 == 0) {
          return 0;
        }
        iVar8 = strcmp(*(char **)(expr1 + 1),*(char **)(expr2 + 1));
        if (iVar8 != 0) {
          return 0;
        }
      }
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar8 = coda_expression_is_equal
                          (*(coda_expression **)(&expr1[1].is_constant + (long)local_34 * 2),
                           *(coda_expression **)(&expr2[1].is_constant + (long)local_34 * 2));
        if (iVar8 == 0) {
          return 0;
        }
      }
      expr1_local._4_4_ = 1;
    }
  }
  else {
    expr1_local._4_4_ = 0;
  }
  return expr1_local._4_4_;
}

Assistant:

LIBCODA_API int coda_expression_is_equal(const coda_expression *expr1, const coda_expression *expr2)
{
    if (expr1 == NULL)
    {
        return expr2 == NULL;
    }
    if (expr2 == NULL)
    {
        return 0;
    }

    if (expr1->tag != expr2->tag)
    {
        return 0;
    }

    switch (expr1->tag)
    {
        case expr_constant_boolean:
            return ((coda_expression_bool_constant *)expr1)->value == ((coda_expression_bool_constant *)expr2)->value;
        case expr_constant_float:
            return ((coda_expression_float_constant *)expr1)->value == ((coda_expression_float_constant *)expr2)->value;
        case expr_constant_integer:
            return ((coda_expression_integer_constant *)expr1)->value ==
                ((coda_expression_integer_constant *)expr2)->value;
        case expr_constant_rawstring:
        case expr_constant_string:
            if (((coda_expression_string_constant *)expr1)->length !=
                ((coda_expression_string_constant *)expr2)->length)
            {
                return 0;
            }
            return memcmp(((coda_expression_string_constant *)expr1)->value,
                          ((coda_expression_string_constant *)expr2)->value,
                          ((coda_expression_string_constant *)expr1)->length) == 0;
        default:
            {
                coda_expression_operation *op1 = (coda_expression_operation *)expr1;
                coda_expression_operation *op2 = (coda_expression_operation *)expr2;
                int i;

                if (op1->identifier != NULL)
                {
                    if (op2->identifier == NULL)
                    {
                        return 0;
                    }
                    if (strcmp(op1->identifier, op2->identifier) != 0)
                    {
                        return 0;
                    }
                }
                else if (op2->identifier != NULL)
                {
                    return 0;
                }
                for (i = 0; i < 4; i++)
                {
                    if (!coda_expression_is_equal(op1->operand[i], op2->operand[i]))
                    {
                        return 0;
                    }
                }
            }
    }

    return 1;
}